

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined8 *puVar12;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  bool bVar13;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_4;
  Mat borderm_1;
  int z;
  __m128 pad_value_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m_1;
  __m128 pad_value_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  __m128 pad_value_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  __m128 pad_value;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_3;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_5;
  Mat *m_2;
  undefined8 in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b8;
  int in_stack_fffffffffffff4bc;
  Mat *in_stack_fffffffffffff4c0;
  int in_stack_fffffffffffff4c8;
  int in_stack_fffffffffffff4cc;
  undefined4 in_stack_fffffffffffff4d0;
  int in_stack_fffffffffffff4d4;
  undefined8 in_stack_fffffffffffff4d8;
  int _w;
  Mat *in_stack_fffffffffffff4e0;
  Mat *in_stack_fffffffffffff4e8;
  Mat *in_stack_fffffffffffff4f0;
  Mat *pMVar14;
  int in_stack_fffffffffffff530;
  Allocator *in_stack_fffffffffffff538;
  Allocator *in_stack_fffffffffffff540;
  undefined8 local_a98;
  undefined8 in_stack_fffffffffffff570;
  undefined8 uVar15;
  int in_stack_fffffffffffff578;
  int in_stack_fffffffffffff57c;
  Mat *in_stack_fffffffffffff580;
  undefined7 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58f;
  undefined8 local_a28;
  undefined8 uStack_a20;
  int local_9ac;
  undefined1 local_948 [40];
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  size_t local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined4 local_8e8;
  Allocator *local_8e0;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined8 local_8c0;
  Mat local_8b8;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  Allocator *local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined8 local_830;
  Mat local_828;
  int local_7dc;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  void *local_7b0;
  int *local_7a8;
  size_t local_7a0;
  int local_798;
  Allocator *local_790;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  Option *in_stack_fffffffffffff888;
  Mat *in_stack_fffffffffffff890;
  Mat *in_stack_fffffffffffff898;
  Padding *in_stack_fffffffffffff8a0;
  Mat local_740;
  int local_6f8;
  int local_6f4;
  Option *in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  Padding_x86 *in_stack_fffffffffffff928;
  int local_634;
  int local_51c;
  undefined4 *local_518;
  int local_4ec;
  undefined8 *local_4e8;
  
  if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0)) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0)) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0 &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)))) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == 0)) {
    if (in_RDX != in_RSI) {
      if (in_RSI->refcount != (int *)0x0) {
        LOCK();
        *in_RSI->refcount = *in_RSI->refcount + 1;
        UNLOCK();
      }
      if (in_RDX->refcount != (int *)0x0) {
        piVar6 = in_RDX->refcount;
        LOCK();
        iVar1 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (in_RDX->allocator == (Allocator *)0x0) {
            if (in_RDX->data != (void *)0x0) {
              free(in_RDX->data);
            }
          }
          else {
            (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
          }
        }
      }
      in_RDX->data = (void *)0x0;
      in_RDX->elemsize = 0;
      in_RDX->elempack = 0;
      in_RDX->dims = 0;
      in_RDX->w = 0;
      in_RDX->h = 0;
      in_RDX->d = 0;
      in_RDX->c = 0;
      in_RDX->cstep = 0;
      in_RDX->refcount = (int *)0x0;
      in_RDX->data = in_RSI->data;
      in_RDX->refcount = in_RSI->refcount;
      in_RDX->elemsize = in_RSI->elemsize;
      in_RDX->elempack = in_RSI->elempack;
      in_RDX->allocator = in_RSI->allocator;
      in_RDX->dims = in_RSI->dims;
      in_RDX->w = in_RSI->w;
      in_RDX->h = in_RSI->h;
      in_RDX->d = in_RSI->d;
      in_RDX->c = in_RSI->c;
      in_RDX->cstep = in_RSI->cstep;
    }
    local_634 = 0;
  }
  else {
    if (in_RSI->elempack == 0) {
      local_9ac = 0;
    }
    else {
      uVar11 = in_RSI->elemsize << 3;
      local_9ac = (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
                       (long)in_RSI->elempack);
    }
    if (local_9ac == 8) {
      local_634 = forward_int8(in_stack_fffffffffffff928,
                               (Mat *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (Mat *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                               in_stack_fffffffffffff910);
    }
    else {
      iVar1 = in_RSI->d;
      iVar3 = in_RSI->c;
      iVar4 = in_RSI->dims;
      iVar5 = in_RSI->elempack;
      if (iVar5 == 4) {
        _w = (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20);
        if (iVar4 == 1) {
          iVar8 = 1;
          if ((in_RSI->w * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) % 4 == 0) {
            iVar8 = 4;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 4 == 0) && (iVar8 == 4)
              ) && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create(in_stack_fffffffffffff4e0,_w,
                        CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                        in_stack_fffffffffffff4cc,(Allocator *)in_stack_fffffffffffff4c0);
            bVar13 = true;
            if (in_RDX->data != (void *)0x0) {
              bVar13 = in_RDX->cstep * (long)in_RDX->c == 0;
            }
            if (!bVar13) {
              uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              v[1] = (float)uVar2;
              v[0] = (float)uVar2;
              v[3] = (float)in_XMM1_Db;
              v[2] = (float)in_XMM1_Da;
              padding_constant_pack4_sse
                        (in_RSI,in_RDX,0,0,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / 4,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) / 4,v);
              return 0;
            }
            return -100;
          }
        }
        if (iVar4 == 2) {
          iVar8 = 1;
          if ((in_RSI->h * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)) % 4 == 0) {
            iVar8 = 4;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) && (iVar8 == 4)
              ) && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create(in_stack_fffffffffffff4e0,_w,(int)in_stack_fffffffffffff4d8,
                        CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                        in_stack_fffffffffffff4cc,(Allocator *)in_stack_fffffffffffff4c0);
            bVar13 = true;
            if (in_RDX->data != (void *)0x0) {
              bVar13 = in_RDX->cstep * (long)in_RDX->c == 0;
            }
            if (!bVar13) {
              uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              v_00[1] = (float)uVar2;
              v_00[0] = (float)uVar2;
              v_00[3] = (float)in_XMM1_Db;
              v_00[2] = (float)in_XMM1_Da;
              padding_constant_pack4_sse
                        (in_RSI,in_RDX,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / 4,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 4,
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc),v_00);
              return 0;
            }
            return -100;
          }
        }
        iVar8 = (int)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
        if (iVar4 == 3) {
          iVar9 = iVar3 * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          iVar10 = 1;
          if (iVar9 % 4 == 0) {
            iVar10 = 4;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 4 == 0) &&
              (iVar10 == 4)) &&
             ((iVar9 == iVar3 * 4 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
            Mat::create(in_stack_fffffffffffff4e0,_w,(int)in_stack_fffffffffffff4d8,
                        in_stack_fffffffffffff4d4,
                        CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),iVar8,
                        in_stack_fffffffffffff540);
            bVar13 = true;
            if (in_RDX->data != (void *)0x0) {
              bVar13 = in_RDX->cstep * (long)in_RDX->c == 0;
            }
            if (!bVar13) {
              local_6f4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / 4;
              for (local_6f8 = 0; local_6f8 < iVar9 / iVar10; local_6f8 = local_6f8 + 1) {
                local_740.w = in_RDX->w;
                local_740.h = in_RDX->h;
                local_740.c = in_RDX->d;
                local_740.data =
                     (void *)((long)in_RDX->data +
                             in_RDX->cstep * (long)local_6f8 * in_RDX->elemsize);
                local_740.elemsize = in_RDX->elemsize;
                local_740.elempack = in_RDX->elempack;
                local_740.allocator = in_RDX->allocator;
                local_740.refcount = (int *)0x0;
                local_740.d = 1;
                local_740.cstep =
                     ((long)local_740.w * (long)local_740.h * local_740.elemsize + 0xf &
                     0xfffffffffffffff0) / local_740.elemsize;
                local_740.dims = in_RDX->dims + -1;
                if (in_RDX->dims == 4) {
                  local_740.cstep = (long)in_RDX->w * (long)in_RDX->h;
                }
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  local_a28 = CONCAT44(uVar2,uVar2);
                  uStack_a20 = CONCAT44(uVar2,uVar2);
                }
                else {
                  puVar12 = (undefined8 *)
                            (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) +
                            (long)(local_6f8 << 2) * 4);
                  local_a28 = *puVar12;
                  uStack_a20 = puVar12[1];
                }
                if ((local_6f8 - local_6f4 < 0) || (iVar3 <= local_6f8 - local_6f4)) {
                  local_4e8 = (undefined8 *)local_740.data;
                  for (local_4ec = 0; local_4ec < (int)local_740.cstep * local_740.c;
                      local_4ec = local_4ec + 1) {
                    *local_4e8 = local_a28;
                    local_4e8[1] = uStack_a20;
                    local_4e8 = local_4e8 + 2;
                  }
                }
                else {
                  local_784 = in_RSI->w;
                  local_780 = in_RSI->h;
                  local_7b0 = (void *)((long)in_RSI->data +
                                      in_RSI->cstep * (long)(local_6f8 - local_6f4) *
                                      in_RSI->elemsize);
                  local_7a0 = in_RSI->elemsize;
                  local_798 = in_RSI->elempack;
                  local_790 = in_RSI->allocator;
                  local_7a8 = (int *)0x0;
                  local_77c = 1;
                  local_788 = in_RSI->dims + -1;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                    lVar7 = *(long *)(*in_RDI + -0x18);
                    v_01[3] = (float)in_XMM1_Db;
                    v_01[2] = (float)in_XMM1_Da;
                    v_01[0] = (float)(undefined4)local_a28;
                    v_01[1] = (float)local_a28._4_4_;
                    padding_constant_pack4_sse
                              ((Mat *)&local_7b0,&local_740,*(int *)((long)in_RDI + lVar7 + 0xd0),
                               *(int *)((long)in_RDI + lVar7 + 0xd4),
                               *(int *)((long)in_RDI + lVar7 + 0xd8),
                               *(int *)((long)in_RDI + lVar7 + 0xdc),v_01);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                    padding_replicate_pack4_sse
                              ((Mat *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                               in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc,
                               in_stack_fffffffffffff4b8,
                               (int)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                               (int)in_stack_fffffffffffff4b0);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                    padding_reflect_pack4_sse
                              ((Mat *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                               in_stack_fffffffffffff580,in_stack_fffffffffffff57c,
                               in_stack_fffffffffffff578,
                               (int)((ulong)in_stack_fffffffffffff570 >> 0x20),
                               (int)in_stack_fffffffffffff570);
                  }
                  if (local_7a8 != (int *)0x0) {
                    LOCK();
                    iVar1 = *local_7a8;
                    *local_7a8 = *local_7a8 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (local_790 == (Allocator *)0x0) {
                        if (local_7b0 != (void *)0x0) {
                          free(local_7b0);
                        }
                      }
                      else {
                        (*local_790->_vptr_Allocator[3])(local_790,local_7b0);
                      }
                    }
                  }
                  local_7b0 = (void *)0x0;
                  local_7a0 = 0;
                  local_798 = 0;
                  local_788 = 0;
                  local_784 = 0;
                  local_780 = 0;
                  local_77c = 0;
                  local_7a8 = (int *)0x0;
                }
                if (local_740.refcount != (int *)0x0) {
                  LOCK();
                  iVar1 = *local_740.refcount;
                  *local_740.refcount = *local_740.refcount + -1;
                  UNLOCK();
                  if (iVar1 == 1) {
                    if (local_740.allocator == (Allocator *)0x0) {
                      if ((undefined8 *)local_740.data != (undefined8 *)0x0) {
                        free(local_740.data);
                      }
                    }
                    else {
                      (*(local_740.allocator)->_vptr_Allocator[3])
                                (local_740.allocator,local_740.data);
                    }
                  }
                }
              }
              return 0;
            }
            return -100;
          }
        }
        if (iVar4 == 4) {
          local_7b4 = in_RSI->w + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          local_7b8 = in_RSI->h + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_7bc = iVar1 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                        in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8,iVar8,
                        (int)in_stack_fffffffffffff4c0,
                        CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8),
                        in_stack_fffffffffffff530,in_stack_fffffffffffff538);
            bVar13 = true;
            if (in_RDX->data != (void *)0x0) {
              bVar13 = in_RDX->cstep * (long)in_RDX->c == 0;
            }
            if (!bVar13) {
              for (local_7c0 = 0; local_7c0 < iVar3; local_7c0 = local_7c0 + 1) {
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  local_a98 = CONCAT44(uVar2,uVar2);
                  uVar15 = CONCAT44(uVar2,uVar2);
                }
                else {
                  puVar12 = (undefined8 *)
                            (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) +
                            (long)(local_7c0 << 2) * 4);
                  local_a98 = *puVar12;
                  uVar15 = puVar12[1];
                }
                uStack_7d0 = (undefined4)uVar15;
                uStack_7cc = (undefined4)((ulong)uVar15 >> 0x20);
                local_7d8 = (undefined4)local_a98;
                uStack_7d4 = local_a98._4_4_;
                for (local_7dc = 0; local_7dc < local_7bc; local_7dc = local_7dc + 1) {
                  local_828.w = in_RDX->w;
                  local_828.h = in_RDX->h;
                  local_828.elemsize = in_RDX->elemsize;
                  local_828.elempack = in_RDX->elempack;
                  local_850 = in_RDX->allocator;
                  local_828.data =
                       (void *)((long)in_RDX->data +
                               (long)local_828.w * (long)local_828.h * (long)local_7dc *
                               local_828.elemsize +
                               in_RDX->cstep * (long)local_7c0 * in_RDX->elemsize);
                  local_828.cstep = (long)local_828.w * (long)local_828.h;
                  local_828.c = 1;
                  local_828.d = 1;
                  local_828.dims = 2;
                  local_828.refcount = (int *)0x0;
                  local_870 = 0;
                  local_860 = 0;
                  local_858 = 0;
                  local_848 = 0;
                  local_844 = 0;
                  local_840 = 0;
                  local_83c = 0;
                  local_838 = 0;
                  local_830 = 0;
                  local_868 = 0;
                  local_828.allocator = local_850;
                  if ((local_7dc - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0)
                     || (iVar1 <= local_7dc -
                                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8))) {
                    local_518 = (undefined4 *)local_828.data;
                    for (local_51c = 0; local_51c < (int)local_828.cstep; local_51c = local_51c + 1)
                    {
                      *local_518 = local_7d8;
                      local_518[1] = uStack_7d4;
                      local_518[2] = uStack_7d0;
                      local_518[3] = uStack_7cc;
                      local_518 = local_518 + 4;
                    }
                  }
                  else {
                    local_8b8.w = in_RSI->w;
                    local_8b8.h = in_RSI->h;
                    local_8b8.elemsize = in_RSI->elemsize;
                    local_8b8.elempack = in_RSI->elempack;
                    local_8e0 = in_RSI->allocator;
                    local_8b8.data =
                         (void *)((long)in_RSI->data +
                                 (long)local_8b8.w * (long)local_8b8.h *
                                 (long)(local_7dc -
                                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) *
                                 local_8b8.elemsize +
                                 in_RSI->cstep * (long)local_7c0 * in_RSI->elemsize);
                    local_8b8.cstep = (long)local_8b8.w * (long)local_8b8.h;
                    local_828.c = 1;
                    local_828.d = 1;
                    local_828.dims = 2;
                    local_828.refcount = (int *)0x0;
                    local_838 = 0;
                    local_83c = 0;
                    local_840 = 0;
                    local_844 = 0;
                    local_858 = 0;
                    local_860 = 0;
                    local_868 = 0;
                    local_870 = 0;
                    local_8b8.c = 1;
                    local_8b8.d = 1;
                    local_8b8.dims = 2;
                    local_8b8.refcount = (int *)0x0;
                    local_830 = 0;
                    local_848 = 0;
                    local_900 = 0;
                    local_8f0 = 0;
                    local_8e8 = 0;
                    local_8d8 = 0;
                    local_8d4 = 0;
                    local_8d0 = 0;
                    local_8cc = 0;
                    local_8c8 = 0;
                    local_8c0 = 0;
                    local_8f8 = 0;
                    lVar7 = *(long *)(*in_RDI + -0x18);
                    v_02[1] = (float)uStack_7d4;
                    v_02[0] = (float)local_7d8;
                    v_02[3] = (float)in_XMM1_Db;
                    v_02[2] = (float)in_XMM1_Da;
                    local_8b8.allocator = local_8e0;
                    padding_constant_pack4_sse
                              (&local_8b8,&local_828,*(int *)((long)in_RDI + lVar7 + 0xd0),
                               *(int *)((long)in_RDI + lVar7 + 0xd4),
                               *(int *)((long)in_RDI + lVar7 + 0xd8),
                               *(int *)((long)in_RDI + lVar7 + 0xdc),v_02);
                    if (local_8b8.refcount != (int *)0x0) {
                      LOCK();
                      iVar4 = *local_8b8.refcount;
                      *local_8b8.refcount = *local_8b8.refcount + -1;
                      UNLOCK();
                      if (iVar4 == 1) {
                        if (local_8b8.allocator == (Allocator *)0x0) {
                          if (local_8b8.data != (void *)0x0) {
                            free(local_8b8.data);
                          }
                        }
                        else {
                          (*(local_8b8.allocator)->_vptr_Allocator[3])
                                    (local_8b8.allocator,local_8b8.data);
                        }
                      }
                    }
                    local_8b8.data = (void *)0x0;
                    local_8b8.elemsize = 0;
                    local_8b8.elempack = 0;
                    local_8b8.dims = 0;
                    local_8b8.w = 0;
                    local_8b8.h = 0;
                    local_8b8.d = 0;
                    local_8b8.c = 0;
                    local_8b8.cstep = 0;
                    local_8b8.refcount = (int *)0x0;
                  }
                  pMVar14 = &local_828;
                  if (local_828.refcount != (int *)0x0) {
                    LOCK();
                    iVar4 = *local_828.refcount;
                    *local_828.refcount = *local_828.refcount + -1;
                    UNLOCK();
                    if (iVar4 == 1) {
                      if (local_828.allocator == (Allocator *)0x0) {
                        if ((undefined4 *)local_828.data != (undefined4 *)0x0) {
                          free(local_828.data);
                        }
                      }
                      else {
                        (*(local_828.allocator)->_vptr_Allocator[3])
                                  (local_828.allocator,local_828.data);
                      }
                    }
                  }
                  pMVar14->data = (void *)0x0;
                  pMVar14->elemsize = 0;
                  pMVar14->elempack = 0;
                  pMVar14->dims = 0;
                  pMVar14->w = 0;
                  pMVar14->h = 0;
                  pMVar14->d = 0;
                  pMVar14->c = 0;
                  pMVar14->cstep = 0;
                  pMVar14->refcount = (int *)0x0;
                }
              }
              return 0;
            }
            return -100;
          }
        }
      }
      local_948._0_8_ = in_RSI->data;
      local_948._8_8_ = in_RSI->refcount;
      local_948._16_8_ = in_RSI->elemsize;
      local_948._24_4_ = in_RSI->elempack;
      local_948._32_8_ = in_RSI->allocator;
      local_920 = in_RSI->dims;
      local_91c = in_RSI->w;
      local_918 = in_RSI->h;
      local_914 = in_RSI->d;
      local_910 = in_RSI->c;
      local_908 = in_RSI->cstep;
      if ((Allocator *)local_948._8_8_ != (Allocator *)0x0) {
        LOCK();
        *(int *)&((Allocator *)local_948._8_8_)->_vptr_Allocator =
             *(int *)&((Allocator *)local_948._8_8_)->_vptr_Allocator + 1;
        UNLOCK();
      }
      if (iVar5 != 1) {
        convert_packing(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,
                        (int)((ulong)local_948 >> 0x20),(Option *)local_948);
      }
      local_634 = Padding::forward(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
                                   in_stack_fffffffffffff890,in_stack_fffffffffffff888);
      puVar12 = (undefined8 *)local_948;
      if ((Allocator *)local_948._8_8_ != (Allocator *)0x0) {
        LOCK();
        iVar1 = *(int *)(_func_int ***)local_948._8_8_;
        *(int *)(_func_int ***)local_948._8_8_ = *(int *)(_func_int ***)local_948._8_8_ + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if ((Allocator *)local_948._32_8_ == (Allocator *)0x0) {
            if ((void *)local_948._0_8_ != (void *)0x0) {
              free((void *)local_948._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_948._32_8_)[3])(local_948._32_8_,local_948._0_8_);
          }
        }
      }
      *puVar12 = 0;
      puVar12[2] = 0;
      *(undefined4 *)(puVar12 + 3) = 0;
      *(undefined4 *)(puVar12 + 5) = 0;
      *(undefined4 *)((long)puVar12 + 0x2c) = 0;
      *(undefined4 *)(puVar12 + 6) = 0;
      *(undefined4 *)((long)puVar12 + 0x34) = 0;
      *(undefined4 *)(puVar12 + 7) = 0;
      puVar12[8] = 0;
      puVar12[1] = 0;
    }
  }
  return local_634;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}